

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportDensity(HighsSimplexAnalysis *this,bool header)

{
  type pbVar1;
  byte in_SIL;
  long in_RDI;
  double use_steepest_edge_density;
  bool rp_steepest_edge;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  string local_80 [32];
  string local_60 [24];
  double in_stack_ffffffffffffffb8;
  HighsSimplexAnalysis *in_stack_ffffffffffffffc0;
  string local_30 [38];
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = *(int *)(in_RDI + 0xfc) == 2;
  if (local_9 == 0) {
    reportOneDensity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    reportOneDensity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    reportOneDensity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    reportOneDensity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff40);
    highsFormatToString_abi_cxx11_((char *)local_30," C_Aq R_Ep R_Ap");
    std::operator<<((ostream *)(pbVar1 + 0x10),local_30);
    std::__cxx11::string::~string(local_30);
    if ((local_a & 1) == 0) {
      pbVar1 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_ffffffffffffff40);
      pbVar1 = pbVar1 + 0x10;
      highsFormatToString_abi_cxx11_((char *)local_80,"     ");
      std::operator<<((ostream *)pbVar1,local_80);
      std::__cxx11::string::~string(local_80);
    }
    else {
      pbVar1 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_ffffffffffffff40);
      highsFormatToString_abi_cxx11_((char *)local_60," S_Ed");
      std::operator<<((ostream *)(pbVar1 + 0x10),local_60);
      std::__cxx11::string::~string(local_60);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportDensity(const bool header) {
  assert(analyse_simplex_runtime_data);
  const bool rp_steepest_edge =
      edge_weight_mode == EdgeWeightMode::kSteepestEdge;
  if (header) {
    *analysis_log << highsFormatToString(" C_Aq R_Ep R_Ap");
    if (rp_steepest_edge) {
      *analysis_log << highsFormatToString(" S_Ed");
    } else {
      *analysis_log << highsFormatToString("     ");
    }
  } else {
    reportOneDensity(col_aq_density);
    reportOneDensity(row_ep_density);
    reportOneDensity(row_ap_density);
    double use_steepest_edge_density;
    if (rp_steepest_edge) {
      if (simplex_strategy == kSimplexStrategyPrimal) {
        use_steepest_edge_density = col_steepest_edge_density;
      } else {
        use_steepest_edge_density = row_DSE_density;
      }
    } else {
      use_steepest_edge_density = 0;
    }
    reportOneDensity(use_steepest_edge_density);
  }
}